

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ushort uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined2 uVar6;
  void *pvVar7;
  ulong uVar8;
  UINT8 UVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  UINT32 UVar15;
  int iVar16;
  VGMPlayer *this;
  S98Player *this_00;
  DROPlayer *this_01;
  GYMPlayer *this_02;
  Config *pCVar17;
  char *pcVar18;
  DATA_LOADER *loader;
  PlayerBase *pPVar19;
  S98_HEADER *pSVar20;
  VGM_HEADER *pVVar21;
  DRO_HEADER *pDVar22;
  undefined4 extraout_var;
  undefined8 uVar23;
  size_type sVar24;
  long lVar25;
  reference pvVar26;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  double dVar27;
  double dVar28;
  VGMPlayer *local_338;
  DROPlayer *local_300;
  VGMPlayer *local_2d0;
  S98Player *local_2a0;
  UINT32 destPos;
  UINT8 pbPos10;
  UINT32 maxPos;
  int letter;
  int inkey;
  UINT32 wrtBytes;
  string pbMode;
  DACSTRM_DEV *strmDev;
  char *pState;
  VGMPlayer *vgmplay_1;
  vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_> *vgmPcmStrms;
  reference local_1f0;
  PLR_DEV_INFO *pdi;
  ulong local_1c8;
  size_t curDev;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> diList;
  ushort local_1a0;
  ushort local_19e;
  PLR_SONG_INFO sInf;
  UINT32 devOptID;
  PLR_DEV_OPTS devOpts;
  char **t;
  char **tagList;
  char *songComment;
  char *songDate;
  char *songSystem;
  char *songGame;
  char *songAuthor;
  char *songTitle;
  char *hwType;
  DRO_HEADER *drohdr;
  DROPlayer *droplay;
  VGM_HEADER *vgmhdr;
  VGMPlayer *vgmplay;
  S98_HEADER *s98hdr;
  S98Player *s98play;
  PlayerBase *player;
  Config pCfg;
  int local_2c;
  bool needRefresh;
  int curSong;
  DATA_LOADER *dLoad;
  UINT8 retVal;
  int argbase;
  char **argv_local;
  int argc_local;
  undefined4 uVar3;
  undefined3 uVar5;
  
  if (argc < 2) {
    printf("Usage: %s inputfile\n",*argv);
    argv_local._4_4_ = 0;
  }
  else {
    UVar9 = InitAudioSystem();
    if (UVar9 == '\0') {
      UVar9 = StartAudioDevice();
      if (UVar9 == '\0') {
        playState = '\0';
        this = (VGMPlayer *)operator_new(0x6a40);
        VGMPlayer::VGMPlayer(this);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)this);
        this_00 = (S98Player *)operator_new(0x1eb0);
        S98Player::S98Player(this_00);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)this_00);
        this_01 = (DROPlayer *)operator_new(0x3f8);
        DROPlayer::DROPlayer(this_01);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)this_01);
        this_02 = (GYMPlayer *)operator_new(0x330);
        GYMPlayer::GYMPlayer(this_02);
        PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)this_02);
        PlayerA::SetEventCallback(&mainPlr,FilePlayCallback,(void *)0x0);
        PlayerA::SetFileReqCallback(&mainPlr,RequestFileCallback,(void *)0x0);
        PlayerA::SetLogCallback(&mainPlr,PlayerLogCallback,(void *)0x0);
        pCVar17 = PlayerA::GetConfiguration(&mainPlr);
        uVar2 = pCVar17->ignoreVolGain;
        uVar4 = pCVar17->chnInvert;
        uVar6 = *(undefined2 *)&pCVar17->field_0x6;
        uVar5 = CONCAT21(uVar6,uVar4);
        uVar3 = CONCAT31(uVar5,uVar2);
        player = (PlayerBase *)CONCAT44(uVar3,masterVol);
        iVar12 = sampleRate << 2;
        pCfg.ignoreVolGain = (bool)(char)iVar12;
        pCfg.chnInvert = (char)((uint)iVar12 >> 8);
        pCfg._6_2_ = (short)((uint)iVar12 >> 0x10);
        pCfg.masterVol = maxLoops;
        pCfg.fadeSmpls = (UINT32)((ulong)*(undefined8 *)&pCVar17->endSilenceSmpls >> 0x20);
        pCfg.loopCount = sampleRate >> 1;
        pCfg.endSilenceSmpls = 0;
        pCfg._20_4_ = 0x3ff00000;
        PlayerA::SetConfiguration(&mainPlr,(Config *)&player);
        for (local_2c = 1; local_2c < argc; local_2c = local_2c + 1) {
          pcVar18 = GetFileTitle(argv[local_2c]);
          printf("Loading %s ...  ",pcVar18);
          fflush(_stdout);
          loader = FileLoader_Init(argv[local_2c]);
          if (loader != (DATA_LOADER *)0x0) {
            DataLoader_SetPreloadBytes(loader,0x100);
            bVar10 = DataLoader_Load(loader);
            if (bVar10 == 0) {
              bVar10 = PlayerA::LoadFile(&mainPlr,loader);
              if (bVar10 == 0) {
                pPVar19 = PlayerA::GetPlayer(&mainPlr);
                PlayerA::SetLoopCount(&mainPlr,maxLoops);
                iVar12 = (*pPVar19->_vptr_PlayerBase[2])();
                if (iVar12 == 0x53393800) {
                  if (pPVar19 == (PlayerBase *)0x0) {
                    local_2a0 = (S98Player *)0x0;
                  }
                  else {
                    local_2a0 = (S98Player *)
                                __dynamic_cast(pPVar19,&PlayerBase::typeinfo,&S98Player::typeinfo,0)
                    ;
                  }
                  pSVar20 = S98Player::GetFileHeader(local_2a0);
                  bVar10 = pSVar20->fileVer;
                  uVar13 = (*pPVar19->_vptr_PlayerBase[0x1c])();
                  (*pPVar19->_vptr_PlayerBase[0x17])(pPVar19,(ulong)uVar13);
                  uVar13 = (*pPVar19->_vptr_PlayerBase[0x1d])();
                  (*pPVar19->_vptr_PlayerBase[0x17])(pPVar19,(ulong)uVar13);
                  printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u",
                         extraout_XMM0_Qa,extraout_XMM0_Qa_00,(ulong)bVar10,(ulong)pSVar20->tickMult
                         ,(ulong)pSVar20->tickDiv);
                }
                else {
                  iVar12 = (*pPVar19->_vptr_PlayerBase[2])();
                  if (iVar12 == 0x56474d00) {
                    if (pPVar19 == (PlayerBase *)0x0) {
                      local_2d0 = (VGMPlayer *)0x0;
                    }
                    else {
                      local_2d0 = (VGMPlayer *)
                                  __dynamic_cast(pPVar19,&PlayerBase::typeinfo,&VGMPlayer::typeinfo,
                                                 0);
                    }
                    pVVar21 = VGMPlayer::GetFileHeader(local_2d0);
                    uVar13 = pVVar21->fileVer;
                    uVar14 = (*pPVar19->_vptr_PlayerBase[0x1c])();
                    (*pPVar19->_vptr_PlayerBase[0x17])(pPVar19,(ulong)uVar14);
                    uVar14 = (*pPVar19->_vptr_PlayerBase[0x1d])();
                    (*pPVar19->_vptr_PlayerBase[0x17])(pPVar19,(ulong)uVar14);
                    printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s",extraout_XMM0_Qa_01
                           ,extraout_XMM0_Qa_02,(ulong)uVar13);
                    UVar15 = VGMPlayer::GetModifiedLoopCount(local_2d0,maxLoops);
                    PlayerA::SetLoopCount(&mainPlr,UVar15);
                  }
                  else {
                    iVar12 = (*pPVar19->_vptr_PlayerBase[2])();
                    if (iVar12 == 0x44524f00) {
                      if (pPVar19 == (PlayerBase *)0x0) {
                        local_300 = (DROPlayer *)0x0;
                      }
                      else {
                        local_300 = (DROPlayer *)
                                    __dynamic_cast(pPVar19,&PlayerBase::typeinfo,
                                                   &DROPlayer::typeinfo,0);
                      }
                      pDVar22 = DROPlayer::GetFileHeader(local_300);
                      if (pDVar22->hwType == '\0') {
                        songTitle = "OPL2";
                      }
                      else if (pDVar22->hwType == '\x01') {
                        songTitle = "DualOPL2";
                      }
                      else if (pDVar22->hwType == '\x02') {
                        songTitle = "OPL3";
                      }
                      else {
                        songTitle = "unknown";
                      }
                      uVar1 = pDVar22->verMajor;
                      uVar13 = (*pPVar19->_vptr_PlayerBase[0x1c])();
                      (*pPVar19->_vptr_PlayerBase[0x17])(pPVar19,(ulong)uVar13);
                      printf("DRO v%u, Total Length: %.2f s, HW Type: %s",(ulong)uVar1,songTitle);
                    }
                  }
                }
                if (showTags != '\0') {
                  songAuthor = (char *)0x0;
                  songGame = (char *)0x0;
                  songSystem = (char *)0x0;
                  songDate = (char *)0x0;
                  songComment = (char *)0x0;
                  tagList = (char **)0x0;
                  devOpts.panOpts.chnPan[1]._56_4_ = (*pPVar19->_vptr_PlayerBase[7])();
                  devOpts.panOpts.chnPan[1]._60_4_ = extraout_var;
                  for (; *(long *)devOpts.panOpts.chnPan[1]._56_8_ != 0;
                      devOpts.panOpts.chnPan[1]._56_8_ = devOpts.panOpts.chnPan[1]._56_8_ + 0x10) {
                    iVar12 = strcmp(*(char **)devOpts.panOpts.chnPan[1]._56_8_,"TITLE");
                    if (iVar12 == 0) {
                      songAuthor = *(char **)(devOpts.panOpts.chnPan[1]._56_8_ + 8);
                    }
                    else {
                      iVar12 = strcmp(*(char **)devOpts.panOpts.chnPan[1]._56_8_,"ARTIST");
                      if (iVar12 == 0) {
                        songGame = *(char **)(devOpts.panOpts.chnPan[1]._56_8_ + 8);
                      }
                      else {
                        iVar12 = strcmp(*(char **)devOpts.panOpts.chnPan[1]._56_8_,"GAME");
                        if (iVar12 == 0) {
                          songSystem = *(char **)(devOpts.panOpts.chnPan[1]._56_8_ + 8);
                        }
                        else {
                          iVar12 = strcmp(*(char **)devOpts.panOpts.chnPan[1]._56_8_,"SYSTEM");
                          if (iVar12 == 0) {
                            songDate = *(char **)(devOpts.panOpts.chnPan[1]._56_8_ + 8);
                          }
                          else {
                            iVar12 = strcmp(*(char **)devOpts.panOpts.chnPan[1]._56_8_,"DATE");
                            if (iVar12 == 0) {
                              songComment = *(char **)(devOpts.panOpts.chnPan[1]._56_8_ + 8);
                            }
                            else {
                              iVar12 = strcmp(*(char **)devOpts.panOpts.chnPan[1]._56_8_,"COMMENT");
                              if (iVar12 == 0) {
                                tagList = *(char ***)(devOpts.panOpts.chnPan[1]._56_8_ + 8);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((songAuthor != (char *)0x0) && (*songAuthor != '\0')) {
                    printf("\nSong Title: %s",songAuthor);
                  }
                  if (1 < showTags) {
                    if ((songGame != (char *)0x0) && (*songGame != '\0')) {
                      printf("\nSong Author: %s",songGame);
                    }
                    if ((songSystem != (char *)0x0) && (*songSystem != '\0')) {
                      printf("\nSong Game: %s",songSystem);
                    }
                    if ((songDate != (char *)0x0) && (*songDate != '\0')) {
                      printf("\nSong System: %s",songDate);
                    }
                    if ((songComment != (char *)0x0) && (*songComment != '\0')) {
                      printf("\nSong Date: %s",songComment);
                    }
                    if ((tagList != (char **)0x0) && (*(char *)tagList != '\0')) {
                      printf("\nSong Comment: %s",tagList);
                    }
                  }
                }
                putchar(10);
                sInf.volGain = -0x80000000;
                uVar13 = (*pPVar19->_vptr_PlayerBase[0xb])(pPVar19,0x80000000,&sInf.deviceCnt);
                if ((uVar13 & 0x80) == 0) {
                  if (sInf.deviceCnt == 0) {
                    sInf.deviceCnt = 0x4d41584d;
                  }
                  (*pPVar19->_vptr_PlayerBase[10])
                            (pPVar19,(ulong)(uint)sInf.volGain,&sInf.deviceCnt);
                }
                sInf.volGain = -0x7fffffff;
                uVar13 = (*pPVar19->_vptr_PlayerBase[0xb])(pPVar19,0x80000001,&sInf.deviceCnt);
                if ((uVar13 & 0x80) == 0) {
                  (*pPVar19->_vptr_PlayerBase[10])
                            (pPVar19,(ulong)(uint)sInf.volGain,&sInf.deviceCnt);
                }
                sInf.volGain = -0x7fffffee;
                uVar13 = (*pPVar19->_vptr_PlayerBase[0xb])(pPVar19,0x80000012,&sInf.deviceCnt);
                if ((uVar13 & 0x80) == 0) {
                  (*pPVar19->_vptr_PlayerBase[10])
                            (pPVar19,(ulong)(uint)sInf.volGain,&sInf.deviceCnt);
                }
                sInf.volGain = -0x7fffffe5;
                uVar13 = (*pPVar19->_vptr_PlayerBase[0xb])(pPVar19,0x8000001b,&sInf.deviceCnt);
                if ((uVar13 & 0x80) == 0) {
                  if (sInf.deviceCnt == 0) {
                    sInf.deviceCnt = 0x4d414d45;
                  }
                  (*pPVar19->_vptr_PlayerBase[10])
                            (pPVar19,(ulong)(uint)sInf.volGain,&sInf.deviceCnt);
                }
                PlayerA::Start(&mainPlr);
                if ((showFileInfo & 1U) != 0) {
                  std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::vector
                            ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)&curDev);
                  (*pPVar19->_vptr_PlayerBase[8])
                            (pPVar19,(undefined1 *)
                                     ((long)&diList.
                                             super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                            );
                  (*pPVar19->_vptr_PlayerBase[9])(pPVar19,&curDev);
                  FCC2Str_abi_cxx11_((string *)&pdi,
                                     diList.
                                     super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
                  uVar23 = std::__cxx11::string::c_str();
                  printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
                         uVar23,(ulong)local_1a0,(ulong)local_19e,(ulong)sInf.format,
                         (ulong)(uint)sInf._4_4_,sInf.tickRateMul,sInf.tickRateDiv,sInf.loopTick);
                  std::__cxx11::string::~string((string *)&pdi);
                  for (local_1c8 = 0; uVar8 = local_1c8,
                      sVar24 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::size
                                         ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)
                                          &curDev), uVar8 < sVar24; local_1c8 = local_1c8 + 1) {
                    local_1f0 = std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::operator[]
                                          ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)
                                           &curDev,local_1c8);
                    uVar13 = local_1f0->id;
                    bVar10 = local_1f0->type;
                    UVar9 = local_1f0->instance;
                    FCC2Str_abi_cxx11_((string *)&vgmPcmStrms,local_1f0->core);
                    uVar23 = std::__cxx11::string::c_str();
                    printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
                           (ulong)uVar13,(ulong)bVar10,(ulong)(uint)(int)(char)UVar9,uVar23,
                           (ulong)local_1f0->devCfg->clock,local_1f0->smplRate,
                           (uint)local_1f0->volume);
                    std::__cxx11::string::~string((string *)&vgmPcmStrms);
                  }
                  std::vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>::~vector
                            ((vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> *)&curDev);
                }
                vgmplay_1 = (VGMPlayer *)0x0;
                iVar12 = (*pPVar19->_vptr_PlayerBase[2])();
                if (iVar12 == 0x56474d00) {
                  if (pPVar19 == (PlayerBase *)0x0) {
                    local_338 = (VGMPlayer *)0x0;
                  }
                  else {
                    local_338 = (VGMPlayer *)
                                __dynamic_cast(pPVar19,&PlayerBase::typeinfo,&VGMPlayer::typeinfo,0)
                    ;
                  }
                  vgmplay_1 = (VGMPlayer *)VGMPlayer::GetStreamDevInfo(local_338);
                }
                StartDiskWriter("waveOut.wav");
                if (audDrv == (void *)0x0) {
                  dLoad._3_1_ = 0xff;
                }
                else {
                  dLoad._3_1_ = AudioDrv_SetCallback(audDrv,FillBuffer,&mainPlr);
                }
                manualRenderLoop = dLoad._3_1_ != '\0';
                changemode('\x01');
                playState = playState & 0xfd;
                bVar11 = true;
                while ((playState & 2) == 0) {
                  if ((playState & 4) == 0) {
                    bVar11 = true;
                  }
                  if (bVar11) {
                    if ((playState & 4) == 0) {
                      bVar10 = PlayerA::GetState(&mainPlr);
                      if ((bVar10 & 2) == 0) {
                        bVar10 = PlayerA::GetState(&mainPlr);
                        if ((bVar10 & 0x10) == 0) {
                          strmDev = (DACSTRM_DEV *)anon_var_dwarf_2dcb;
                        }
                        else {
                          strmDev = (DACSTRM_DEV *)anon_var_dwarf_2dc0;
                        }
                      }
                      else {
                        strmDev = (DACSTRM_DEV *)anon_var_dwarf_2db5;
                      }
                    }
                    else {
                      strmDev = (DACSTRM_DEV *)anon_var_dwarf_2daa;
                    }
                    if ((vgmplay_1 == (VGMPlayer *)0x0) ||
                       (bVar11 = std::
                                 vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                 ::empty((vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                          *)vgmplay_1), bVar11)) {
                      dVar27 = PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                      dVar28 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                      printf("%s %.2f / %.2f ...   \r",dVar27,dVar28,strmDev);
                    }
                    else {
                      pbMode.field_2._8_8_ =
                           std::
                           vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
                           operator[]((vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                       *)vgmplay_1,0);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&wrtBytes," ",(allocator *)((long)&inkey + 3));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&inkey + 3));
                      if ((*(byte *)(pbMode.field_2._8_8_ + 0x2a) & 0x10) != 0) {
                        std::__cxx11::string::operator+=((string *)&wrtBytes,'R');
                      }
                      if ((*(byte *)(pbMode.field_2._8_8_ + 0x2a) & 0x80) != 0) {
                        std::__cxx11::string::operator+=((string *)&wrtBytes,'L');
                      }
                      lVar25 = std::__cxx11::string::length();
                      if (lVar25 == 1) {
                        std::__cxx11::string::operator=((string *)&wrtBytes,"");
                      }
                      dVar27 = PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                      dVar28 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                      uVar13 = *(uint *)(pbMode.field_2._8_8_ + 0x2c);
                      iVar12 = *(int *)(pbMode.field_2._8_8_ + 0x30);
                      uVar14 = *(uint *)(pbMode.field_2._8_8_ + 0x34);
                      uVar23 = std::__cxx11::string::c_str();
                      printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",dVar27,dVar28,
                             (double)uVar13 / 1000.0,strmDev,(ulong)(iVar12 + 1),(ulong)uVar14,
                             uVar23);
                      std::__cxx11::string::~string((string *)&wrtBytes);
                    }
                    fflush(_stdout);
                    bVar11 = false;
                  }
                  pvVar7 = audDrvLog;
                  if (((manualRenderLoop & 1U) == 0) || ((playState & 4) != 0)) {
                    usleep(50000);
                  }
                  else {
                    sVar24 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                       (&locAudBuf);
                    pvVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        (&locAudBuf,0);
                    UVar15 = FillBuffer(pvVar7,&mainPlr,(UINT32)sVar24,pvVar26);
                    pvVar7 = audDrvLog;
                    pvVar26 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        (&locAudBuf,0);
                    AudioDrv_WriteData(pvVar7,UVar15,pvVar26);
                  }
                  iVar12 = _kbhit();
                  if (iVar12 != 0) {
                    iVar12 = getchar();
                    iVar16 = toupper(iVar12);
                    if ((iVar16 == 0x20) || (iVar16 == 0x50)) {
                      playState = playState ^ 4;
                      if (audDrv != (void *)0x0) {
                        if ((playState & 4) == 0) {
                          AudioDrv_Resume(audDrv);
                        }
                        else {
                          AudioDrv_Pause(audDrv);
                        }
                      }
                    }
                    else if (iVar16 == 0x52) {
                      OSMutex_Lock(renderMtx);
                      PlayerA::Reset(&mainPlr);
                      OSMutex_Unlock(renderMtx);
                    }
                    else if ((iVar16 < 0x30) || (0x39 < iVar16)) {
                      if (iVar16 == 0x42) {
                        if (1 < local_2c) {
                          playState = playState | 2;
                          local_2c = local_2c + -2;
                        }
                      }
                      else if (iVar16 == 0x4e) {
                        if (local_2c + 1 < argc) {
                          playState = playState | 2;
                        }
                      }
                      else if ((iVar12 == 0x1b) || (iVar16 == 0x51)) {
                        playState = playState | 2;
                        local_2c = argc + -1;
                      }
                      else if (iVar16 == 0x46) {
                        OSMutex_Lock(renderMtx);
                        PlayerA::FadeOut(&mainPlr);
                        OSMutex_Unlock(renderMtx);
                      }
                      else if (iVar16 == 0x43) {
                        changemode('\0');
                        pPVar19 = PlayerA::GetPlayer(&mainPlr);
                        DoChipControlMode(pPVar19);
                        changemode('\x01');
                      }
                    }
                    else {
                      OSMutex_Lock(renderMtx);
                      pPVar19 = PlayerA::GetPlayer(&mainPlr);
                      iVar12 = (*pPVar19->_vptr_PlayerBase[0x1e])(pPVar19,(ulong)maxLoops);
                      PlayerA::Seek(&mainPlr,'\x01',
                                    (iVar12 * (uint)(byte)((char)iVar16 - 0x30)) / 10);
                      OSMutex_Unlock(renderMtx);
                    }
                    bVar11 = true;
                  }
                }
                changemode('\0');
                if (audDrv != (void *)0x0) {
                  AudioDrv_SetCallback(audDrv,(AUDFUNC_FILLBUF)0x0,(void *)0x0);
                }
                StopDiskWriter();
                PlayerA::Stop(&mainPlr);
                PlayerA::UnloadFile(&mainPlr);
                DataLoader_Deinit(loader);
              }
              else {
                DataLoader_Deinit(loader);
                fprintf(_stderr,"Error 0x%02X loading file!\n",(ulong)bVar10);
              }
            }
            else {
              DataLoader_Deinit(loader);
              fprintf(_stderr,"Error 0x%02X loading file!\n",(ulong)bVar10);
            }
          }
        }
        PlayerA::UnregisterAllPlayers(&mainPlr);
        StopAudioDevice();
        DeinitAudioSystem();
        printf("Done.\n");
        argv_local._4_4_ = 0;
      }
      else {
        DeinitAudioSystem();
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	int argbase;
	UINT8 retVal;
	DATA_LOADER *dLoad;
	int curSong;
	bool needRefresh;
	
	if (argc < 2)
	{
		printf("Usage: %s inputfile\n", argv[0]);
		return 0;
	}
	argbase = 1;
#ifdef _WIN32
	SetConsoleOutputCP(65001);	// set UTF-8 codepage
#endif
	
	retVal = InitAudioSystem();
	if (retVal)
		return 1;
	retVal = StartAudioDevice();
	if (retVal)
	{
		DeinitAudioSystem();
		return 1;
	}
	playState = 0x00;
	
	// I'll keep the instances of the players for the program's life time.
	// This way player/chip options are kept between track changes.
	mainPlr.RegisterPlayerEngine(new VGMPlayer);
	mainPlr.RegisterPlayerEngine(new S98Player);
	mainPlr.RegisterPlayerEngine(new DROPlayer);
	mainPlr.RegisterPlayerEngine(new GYMPlayer);
	mainPlr.SetEventCallback(FilePlayCallback, NULL);
	mainPlr.SetFileReqCallback(RequestFileCallback, NULL);
	mainPlr.SetLogCallback(PlayerLogCallback, NULL);
	//mainPlr.SetOutputSettings() is done in StartAudioDevice()
	{
		PlayerA::Config pCfg = mainPlr.GetConfiguration();
		pCfg.masterVol = masterVol;
		pCfg.loopCount = maxLoops;
		pCfg.fadeSmpls = sampleRate * 4;	// fade over 4 seconds
		pCfg.endSilenceSmpls = sampleRate / 2;	// 0.5 seconds of silence at the end
		pCfg.pbSpeed = 1.0;
		mainPlr.SetConfiguration(pCfg);
	}

	for (curSong = argbase; curSong < argc; curSong ++)
	{
	
	printf("Loading %s ...  ", GetFileTitle(argv[curSong]));
	fflush(stdout);

#ifdef USE_MEMORY_LOADER
	UINT32 fileSize;
	UINT8 *fileData = SlurpFile(argv[curSong],&fileSize);
	dLoad = MemoryLoader_Init(fileData, fileSize);
#else
	dLoad = FileLoader_Init(argv[curSong]);
#endif

	if(dLoad == NULL) continue;
	DataLoader_SetPreloadBytes(dLoad,0x100);
	retVal = DataLoader_Load(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	retVal = mainPlr.LoadFile(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	
	PlayerBase* player = mainPlr.GetPlayer();
	mainPlr.SetLoopCount(maxLoops);
	if (player->GetPlayerType() == FCC_S98)
	{
		S98Player* s98play = dynamic_cast<S98Player*>(player);
		const S98_HEADER* s98hdr = s98play->GetFileHeader();
		
		printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u", s98hdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()),
				s98hdr->tickMult, s98hdr->tickDiv);
	}
	else if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		const VGM_HEADER* vgmhdr = vgmplay->GetFileHeader();
		
		printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s", vgmhdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()));
		mainPlr.SetLoopCount(vgmplay->GetModifiedLoopCount(maxLoops));
	}
	else if (player->GetPlayerType() == FCC_DRO)
	{
		DROPlayer* droplay = dynamic_cast<DROPlayer*>(player);
		const DRO_HEADER* drohdr = droplay->GetFileHeader();
		const char* hwType;
		
		if (drohdr->hwType == 0)
			hwType = "OPL2";
		else if (drohdr->hwType == 1)
			hwType = "DualOPL2";
		else if (drohdr->hwType == 2)
			hwType = "OPL3";
		else
			hwType = "unknown";
		printf("DRO v%u, Total Length: %.2f s, HW Type: %s", drohdr->verMajor,
				player->Tick2Second(player->GetTotalTicks()), hwType);
	}
	
	if (showTags > 0)
	{
		const char* songTitle = NULL;
		const char* songAuthor = NULL;
		const char* songGame = NULL;
		const char* songSystem = NULL;
		const char* songDate = NULL;
		const char* songComment = NULL;
	
		const char* const* tagList = player->GetTags();
		for (const char* const* t = tagList; *t; t += 2)
		{
			if (!strcmp(t[0], "TITLE"))
				songTitle = t[1];
			else if (!strcmp(t[0], "ARTIST"))
				songAuthor = t[1];
			else if (!strcmp(t[0], "GAME"))
				songGame = t[1];
			else if (!strcmp(t[0], "SYSTEM"))
				songSystem = t[1];
			else if (!strcmp(t[0], "DATE"))
				songDate = t[1];
			else if (!strcmp(t[0], "COMMENT"))
				songComment = t[1];
		}
		
		if (songTitle != NULL && songTitle[0] != '\0')
			printf("\nSong Title: %s", songTitle);
		if (showTags >= 2)
		{
			if (songAuthor != NULL && songAuthor[0] != '\0')
				printf("\nSong Author: %s", songAuthor);
			if (songGame != NULL && songGame[0] != '\0')
				printf("\nSong Game: %s", songGame);
			if (songSystem != NULL && songSystem[0] != '\0')
				printf("\nSong System: %s", songSystem);
			if (songDate != NULL && songDate[0] != '\0')
				printf("\nSong Date: %s", songDate);
			if (songComment != NULL && songComment[0] != '\0')
				printf("\nSong Comment: %s", songComment);
		}
	}
	
	putchar('\n');
	
	{
		PLR_DEV_OPTS devOpts;
		UINT32 devOptID;
		
		devOptID = PLR_DEV_ID(DEVID_SN76496, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[4] = {0x00, -0x80, +0x80, 0x00};
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAXM;
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_YM2413, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[14] = {
				-0x100, +0x100, -0x80, +0x80, -0x40, +0x40, -0xC0, +0xC0, 0x00,
				-0x60, +0x60, 0x00, -0xC0, +0xC0};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_AY8910, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[3] = {-0x80, +0x80, 0x00};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}

		devOptID = PLR_DEV_ID(DEVID_C6280, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAME;
			player->SetDeviceOptions(devOptID, devOpts);
		}
	}
	
	mainPlr.Start();
	
	if (showFileInfo)
	{
		// only after calling PlayerA::Start() we can obtain info about the currently used sound cores
		PLR_SONG_INFO sInf;
		std::vector<PLR_DEV_INFO> diList;
		size_t curDev;
		
		player->GetSongInfo(sInf);
		player->GetSongDeviceInfo(diList);
		printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
			FCC2Str(sInf.format).c_str(), sInf.fileVerMaj, sInf.fileVerMin,
			sInf.tickRateMul, sInf.tickRateDiv, sInf.songLen, sInf.loopTick, sInf.deviceCnt);
		for (curDev = 0; curDev < diList.size(); curDev ++)
		{
			const PLR_DEV_INFO& pdi = diList[curDev];
			printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
				(int)pdi.id, pdi.type, (INT8)pdi.instance, FCC2Str(pdi.core).c_str(), pdi.devCfg->clock, pdi.smplRate, pdi.volume);
		}
	}
	const std::vector<VGMPlayer::DACSTRM_DEV>* vgmPcmStrms = NULL;
	if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		vgmPcmStrms = &vgmplay->GetStreamDevInfo();
	}
	
	StartDiskWriter("waveOut.wav");
	
	if (audDrv != NULL)
		retVal = AudioDrv_SetCallback(audDrv, FillBuffer, &mainPlr);
	else
		retVal = 0xFF;
	manualRenderLoop = (retVal != 0x00);
#ifndef _WIN32
	changemode(1);
#endif
	playState &= ~PLAYSTATE_END;
	needRefresh = true;
	while(! (playState & PLAYSTATE_END))
	{
		if (! (playState & PLAYSTATE_PAUSE))
			needRefresh = true;	// always update when playing
		if (needRefresh)
		{
			const char* pState;
			
			if (playState & PLAYSTATE_PAUSE)
				pState = "Paused";
			else if (mainPlr.GetState() & PLAYSTATE_END)
				pState = "Finish ";
			else if (mainPlr.GetState() & PLAYSTATE_FADE)
				pState = "Fading ";
			else
				pState = "Playing";
			if (vgmPcmStrms == NULL || vgmPcmStrms->empty())
			{
				printf("%s %.2f / %.2f ...   \r", pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode));
			}
			else
			{
				const VGMPlayer::DACSTRM_DEV* strmDev = &(*vgmPcmStrms)[0];
				std::string pbMode = " ";
				if (strmDev->pbMode & 0x10)
					pbMode += 'R';	// reverse playback
				if (strmDev->pbMode & 0x80)
					pbMode += 'L';	// looping
				if (pbMode.length() == 1)
					pbMode = "";
				printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",
					pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode),
					1 + strmDev->lastItem, strmDev->maxItems, strmDev->freq / 1000.0,
					pbMode.c_str());
			}
			fflush(stdout);
			needRefresh = false;
		}
		
		if (manualRenderLoop && ! (playState & PLAYSTATE_PAUSE))
		{
			UINT32 wrtBytes = FillBuffer(audDrvLog, &mainPlr, (UINT32)locAudBuf.size(), &locAudBuf[0]);
			AudioDrv_WriteData(audDrvLog, wrtBytes, &locAudBuf[0]);
		}
		else
		{
			Sleep(50);
		}
		
		if (_kbhit())
		{
			int inkey = _getch();
			int letter = toupper(inkey);
			
			if (letter == ' ' || letter == 'P')
			{
				playState ^= PLAYSTATE_PAUSE;
				if (audDrv != NULL)
				{
					if (playState & PLAYSTATE_PAUSE)
						AudioDrv_Pause(audDrv);
					else
						AudioDrv_Resume(audDrv);
				}
			}
			else if (letter == 'R')	// restart
			{
				OSMutex_Lock(renderMtx);
				mainPlr.Reset();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter >= '0' && letter <= '9')
			{
				UINT32 maxPos;
				UINT8 pbPos10;
				UINT32 destPos;
				
				OSMutex_Lock(renderMtx);
				maxPos = mainPlr.GetPlayer()->GetTotalPlayTicks(maxLoops);
				pbPos10 = letter - '0';
				destPos = maxPos * pbPos10 / 10;
				mainPlr.Seek(PLAYPOS_TICK, destPos);
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'B')	// previous file
			{
				if (curSong > argbase)
				{
					playState |= PLAYSTATE_END;
					curSong -= 2;
				}
			}
			else if (letter == 'N')	// next file
			{
				if (curSong + 1 < argc)
					playState |= PLAYSTATE_END;
			}
			else if (inkey == 0x1B || letter == 'Q')	// quit
			{
				playState |= PLAYSTATE_END;
				curSong = argc - 1;
			}
			else if (letter == 'F')	// fade out
			{
				OSMutex_Lock(renderMtx);
				mainPlr.FadeOut();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'C')	// chip control
			{
#ifndef _WIN32
				changemode(0);	// make sure entered charactered are echoed
#endif
				DoChipControlMode(mainPlr.GetPlayer());
#ifndef _WIN32
				changemode(1);
#endif
			}
			needRefresh = true;
		}
	}
#ifndef _WIN32
	changemode(0);
#endif
	// remove callback to prevent further rendering
	// also waits for render thread to finish its work
	if (audDrv != NULL)
		AudioDrv_SetCallback(audDrv, NULL, NULL);
	
	StopDiskWriter();
	
	mainPlr.Stop();
	mainPlr.UnloadFile();
	DataLoader_Deinit(dLoad);	dLoad = NULL;
#ifdef USE_MEMORY_LOADER
	free(fileData);
#endif
	
	}	// end for(curSong)
	
	mainPlr.UnregisterAllPlayers();
	
	StopAudioDevice();
	DeinitAudioSystem();
	printf("Done.\n");
	
#if defined(_DEBUG) && (_MSC_VER >= 1400)
	// doesn't work well with C++ containers
	//if (_CrtDumpMemoryLeaks())
	//	_getch();
#endif
	
	return 0;
}